

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall del_file::~del_file(del_file *this)

{
  ~del_file(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual ~del_file() { }